

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Tag::Tag(Tag *this,string_view name)

{
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = name._M_str;
  local_18._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,&local_18,&local_19);
  FuncDeclaration::FuncDeclaration(&this->decl);
  return;
}

Assistant:

explicit Tag(std::string_view name) : name(name) {}